

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  curl_slist *pcVar5;
  char *pcVar6;
  void *pvVar7;
  bool bVar8;
  curl_strdup_callback p_Var9;
  bool bVar10;
  char in_AL;
  int iVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  void **ppvVar15;
  size_t sVar16;
  size_t sVar17;
  char *pcVar18;
  curl_httppost *pcVar19;
  curl_httppost *pcVar20;
  uint uVar21;
  undefined8 in_RCX;
  ulong uVar22;
  curl_httppost **ppcVar23;
  undefined8 in_RDX;
  FormInfo *ptr;
  char *pcVar24;
  char *pcVar25;
  undefined8 in_R8;
  undefined8 in_R9;
  CURLFORMcode CVar26;
  long lVar27;
  int *piVar28;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  void **local_160;
  char *local_150;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_160 = &arg[0].overflow_arg_area;
  uVar21 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  plVar12 = (long *)(*Curl_ccalloc)(1,0x80);
  if (plVar12 == (long *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  bVar8 = false;
  pcVar24 = (char *)0x0;
  piVar28 = (int *)0x0;
  plVar13 = plVar12;
LAB_00495585:
  CVar26 = CURL_FORMADD_OK;
switchD_00495601_caseD_9:
  bVar10 = bVar8;
  do {
    bVar8 = bVar10;
    plVar14 = plVar12;
    if (CVar26 != CURL_FORMADD_OK) goto LAB_00495cf7;
    if ((!bVar8) || (piVar28 == (int *)0x0)) {
      uVar22 = (ulong)uVar21;
      if (uVar22 < 0x29) {
        uVar21 = uVar21 + 8;
        ppvVar15 = (void **)((long)local_e8 + uVar22);
      }
      else {
        ppvVar15 = local_160;
        local_160 = local_160 + 1;
      }
      iVar11 = *(int *)ppvVar15;
      if (iVar11 == 0x11) goto LAB_00495d7f;
      break;
    }
    iVar11 = *piVar28;
    pcVar24 = *(char **)(piVar28 + 2);
    piVar28 = piVar28 + 4;
    CVar26 = CURL_FORMADD_OK;
    bVar10 = false;
  } while (iVar11 == 0x11);
  CVar26 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar18 = pcVar24;
  switch(iVar11) {
  case 1:
    goto switchD_00495601_caseD_1;
  case 2:
    *(byte *)(plVar13 + 8) = *(byte *)(plVar13 + 8) | 4;
switchD_00495601_caseD_1:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (*plVar13 == 0) {
      if (!bVar8) {
        uVar22 = (ulong)uVar21;
        if (uVar22 < 0x29) {
          uVar21 = uVar21 + 8;
          ppvVar15 = (void **)((long)local_e8 + uVar22);
        }
        else {
          ppvVar15 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar18 = (char *)*ppvVar15;
      }
      CVar26 = CURL_FORMADD_NULL;
      if (pcVar18 != (char *)0x0) {
        *plVar13 = (long)pcVar18;
        CVar26 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00495601_caseD_9;
  case 3:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (plVar13[2] == 0) {
      if (!bVar8) {
        uVar22 = (ulong)uVar21;
        if (uVar22 < 0x29) {
          uVar21 = uVar21 + 8;
          ppvVar15 = (void **)((long)local_e8 + uVar22);
        }
        else {
          ppvVar15 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar18 = (char *)*ppvVar15;
      }
      plVar13[2] = (long)pcVar18;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_00495601_caseD_9;
  case 4:
    goto switchD_00495601_caseD_4;
  case 5:
    *(byte *)(plVar13 + 8) = *(byte *)(plVar13 + 8) | 8;
switchD_00495601_caseD_4:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (plVar13[3] != 0) goto switchD_00495601_caseD_9;
    if (!bVar8) {
      uVar22 = (ulong)uVar21;
      if (uVar22 < 0x29) {
        uVar21 = uVar21 + 8;
        ppvVar15 = (void **)((long)local_e8 + uVar22);
      }
      else {
        ppvVar15 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar18 = (char *)*ppvVar15;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar18 == (char *)0x0) goto switchD_00495601_caseD_9;
    break;
  case 6:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (plVar13[5] == 0) {
      if (!bVar8) {
        uVar22 = (ulong)uVar21;
        if (uVar22 < 0x29) {
          uVar21 = uVar21 + 8;
          ppvVar15 = (void **)((long)local_e8 + uVar22);
        }
        else {
          ppvVar15 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar18 = (char *)*ppvVar15;
      }
      plVar13[5] = (long)pcVar18;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_00495601_caseD_9;
  case 7:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if ((*(byte *)(plVar13 + 8) & 10) == 0) {
      if (!bVar8) {
        uVar22 = (ulong)uVar21;
        if (uVar22 < 0x29) {
          uVar21 = uVar21 + 8;
          ppvVar15 = (void **)((long)local_e8 + uVar22);
        }
        else {
          ppvVar15 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar18 = (char *)*ppvVar15;
      }
      CVar26 = CURL_FORMADD_NULL;
      if (pcVar18 != (char *)0x0) {
        pcVar18 = (*Curl_cstrdup)(pcVar18);
        plVar13[3] = (long)pcVar18;
        CVar26 = CURL_FORMADD_MEMORY;
        if (pcVar18 != (char *)0x0) {
          *(byte *)(plVar13 + 8) = *(byte *)(plVar13 + 8) | 2;
          goto LAB_00495c95;
        }
      }
    }
    goto switchD_00495601_caseD_9;
  case 8:
    CVar26 = CURL_FORMADD_ILLEGAL_ARRAY;
    if (!bVar8) {
      uVar22 = (ulong)uVar21;
      if (uVar22 < 0x29) {
        uVar21 = uVar21 + 8;
        ppvVar15 = (void **)((long)local_e8 + uVar22);
      }
      else {
        ppvVar15 = local_160;
        local_160 = local_160 + 1;
      }
      piVar28 = (int *)*ppvVar15;
      bVar8 = piVar28 != (int *)0x0;
      CVar26 = (uint)(piVar28 == (int *)0x0) * 3;
    }
  default:
    goto switchD_00495601_caseD_9;
  case 10:
    if (!bVar8) {
      uVar22 = (ulong)uVar21;
      if (uVar22 < 0x29) {
        uVar21 = uVar21 + 8;
        ppvVar15 = (void **)((long)local_e8 + uVar22);
      }
      else {
        ppvVar15 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar18 = (char *)*ppvVar15;
    }
    if (plVar13[3] == 0) {
      CVar26 = CURL_FORMADD_NULL;
      if (pcVar18 != (char *)0x0) {
        pcVar18 = (*Curl_cstrdup)(pcVar18);
        plVar13[3] = (long)pcVar18;
        CVar26 = CURL_FORMADD_MEMORY;
        if (pcVar18 != (char *)0x0) {
          *(byte *)(plVar13 + 8) = *(byte *)(plVar13 + 8) | 1;
LAB_00495c95:
          *(undefined1 *)(plVar13 + 4) = 1;
          CVar26 = CURL_FORMADD_OK;
        }
      }
    }
    else {
      CVar26 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar13 + 8) & 1) != 0) &&
         (CVar26 = CURL_FORMADD_NULL, pcVar18 != (char *)0x0)) {
        local_150 = (*Curl_cstrdup)(pcVar18);
        CVar26 = CURL_FORMADD_MEMORY;
        if (local_150 != (char *)0x0) {
          plVar14 = (long *)(*Curl_ccalloc)(1,0x80);
          if (plVar14 == (long *)0x0) {
            plVar14 = (long *)0x0;
          }
          else {
            plVar14[3] = (long)local_150;
            plVar14[8] = 1;
            plVar14[0xf] = plVar13[0xf];
            plVar13[0xf] = (long)plVar14;
          }
          if (plVar14 == (long *)0x0) goto LAB_00495cc6;
          *(undefined1 *)(plVar14 + 4) = 1;
          plVar13 = plVar14;
          goto LAB_00495585;
        }
      }
    }
    goto switchD_00495601_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar8) {
      uVar22 = (ulong)uVar21;
      if (uVar22 < 0x29) {
        uVar21 = uVar21 + 8;
        ppvVar15 = (void **)((long)local_e8 + uVar22);
      }
      else {
        ppvVar15 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar18 = (char *)*ppvVar15;
    }
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (plVar13[0xb] == 0) {
      pcVar18 = (*Curl_cstrdup)(pcVar18);
      plVar13[0xb] = (long)pcVar18;
      CVar26 = CURL_FORMADD_MEMORY;
      if (pcVar18 != (char *)0x0) {
        *(undefined1 *)(plVar13 + 0xc) = 1;
        CVar26 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00495601_caseD_9;
  case 0xc:
    *(byte *)(plVar13 + 8) = *(byte *)(plVar13 + 8) | 0x30;
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (plVar13[9] != 0) goto switchD_00495601_caseD_9;
    if (!bVar8) {
      uVar22 = (ulong)uVar21;
      if (uVar22 < 0x29) {
        uVar21 = uVar21 + 8;
        ppvVar15 = (void **)((long)local_e8 + uVar22);
      }
      else {
        ppvVar15 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar18 = (char *)*ppvVar15;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar18 == (char *)0x0) goto switchD_00495601_caseD_9;
    plVar13[9] = (long)pcVar18;
    break;
  case 0xd:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (plVar13[10] == 0) {
      if (!bVar8) {
        uVar22 = (ulong)uVar21;
        if (uVar22 < 0x29) {
          uVar21 = uVar21 + 8;
          ppvVar15 = (void **)((long)local_e8 + uVar22);
        }
        else {
          ppvVar15 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar18 = (char *)*ppvVar15;
      }
      plVar13[10] = (long)pcVar18;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_00495601_caseD_9;
  case 0xe:
    goto switchD_00495601_caseD_e;
  case 0xf:
    if (!bVar8) {
      uVar22 = (ulong)uVar21;
      if (uVar22 < 0x29) {
        uVar21 = uVar21 + 8;
        ppvVar15 = (void **)((long)local_e8 + uVar22);
      }
      else {
        ppvVar15 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar18 = (char *)*ppvVar15;
    }
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (plVar13[0xe] == 0) {
      plVar13[0xe] = (long)pcVar18;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_00495601_caseD_9;
  case 0x13:
    *(byte *)(plVar13 + 8) = *(byte *)(plVar13 + 8) | 0x40;
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (plVar13[0xd] != 0) goto switchD_00495601_caseD_9;
    if (!bVar8) {
      uVar22 = (ulong)uVar21;
      if (uVar22 < 0x29) {
        uVar21 = uVar21 + 8;
        ppvVar15 = (void **)((long)local_e8 + uVar22);
      }
      else {
        ppvVar15 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar18 = (char *)*ppvVar15;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar18 == (char *)0x0) goto switchD_00495601_caseD_9;
    plVar13[0xd] = (long)pcVar18;
  }
  plVar13[3] = (long)pcVar18;
  CVar26 = CURL_FORMADD_OK;
  goto switchD_00495601_caseD_9;
switchD_00495601_caseD_e:
  if (!bVar8) {
    uVar22 = (ulong)uVar21;
    if (uVar22 < 0x29) {
      uVar21 = uVar21 + 8;
      ppvVar15 = (void **)((long)local_e8 + uVar22);
    }
    else {
      ppvVar15 = local_160;
      local_160 = local_160 + 1;
    }
    pcVar18 = (char *)*ppvVar15;
  }
  if (plVar13[6] == 0) {
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar18 != (char *)0x0) {
      pcVar18 = (*Curl_cstrdup)(pcVar18);
      plVar13[6] = (long)pcVar18;
      CVar26 = CURL_FORMADD_MEMORY;
      if (pcVar18 != (char *)0x0) {
        *(undefined1 *)(plVar13 + 7) = 1;
        CVar26 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00495601_caseD_9;
  }
  CVar26 = CURL_FORMADD_OPTION_TWICE;
  if (((*(byte *)(plVar13 + 8) & 1) == 0) || (CVar26 = CURL_FORMADD_NULL, pcVar18 == (char *)0x0))
  goto switchD_00495601_caseD_9;
  local_150 = (*Curl_cstrdup)(pcVar18);
  CVar26 = CURL_FORMADD_MEMORY;
  if (local_150 == (char *)0x0) goto switchD_00495601_caseD_9;
  plVar14 = (long *)(*Curl_ccalloc)(1,0x80);
  if (plVar14 == (long *)0x0) {
    plVar14 = (long *)0x0;
  }
  else {
    plVar14[6] = (long)local_150;
    plVar14[8] = 1;
    plVar14[0xf] = plVar13[0xf];
    plVar13[0xf] = (long)plVar14;
  }
  if (plVar14 == (long *)0x0) {
LAB_00495cc6:
    CVar26 = CURL_FORMADD_MEMORY;
    (*Curl_cfree)(local_150);
    goto switchD_00495601_caseD_9;
  }
  *(undefined1 *)(plVar14 + 7) = 1;
  plVar13 = plVar14;
  goto LAB_00495585;
LAB_00495cf7:
  do {
    if ((char)plVar14[1] == '\x01') {
      if ((void *)*plVar14 != (void *)0x0) {
        (*Curl_cfree)((void *)*plVar14);
        *plVar14 = 0;
      }
      *(undefined1 *)(plVar14 + 1) = 0;
    }
    if ((char)plVar14[4] == '\x01') {
      if ((void *)plVar14[3] != (void *)0x0) {
        (*Curl_cfree)((void *)plVar14[3]);
        plVar14[3] = 0;
      }
      *(undefined1 *)(plVar14 + 4) = 0;
    }
    if ((char)plVar14[7] == '\x01') {
      if ((void *)plVar14[6] != (void *)0x0) {
        (*Curl_cfree)((void *)plVar14[6]);
        plVar14[6] = 0;
      }
      *(undefined1 *)(plVar14 + 7) = 0;
    }
    if ((char)plVar14[0xc] == '\x01') {
      if ((void *)plVar14[0xb] != (void *)0x0) {
        (*Curl_cfree)((void *)plVar14[0xb]);
        plVar14[0xb] = 0;
      }
      *(undefined1 *)(plVar14 + 0xc) = 0;
    }
    plVar13 = plVar14 + 0xf;
    plVar14 = (long *)*plVar13;
  } while ((long *)*plVar13 != (long *)0x0);
  if (CVar26 == CURL_FORMADD_OK) {
LAB_00495d7f:
    CVar26 = CURL_FORMADD_OK;
    pcVar24 = (char *)0x0;
    plVar13 = plVar12;
    pcVar20 = (curl_httppost *)0x0;
    do {
      p_Var9 = Curl_cstrdup;
      if (*plVar13 == 0) {
        if (pcVar20 != (curl_httppost *)0x0) goto LAB_00495dad;
LAB_00496078:
        CVar26 = CURL_FORMADD_INCOMPLETE;
        break;
      }
      if (plVar13[3] == 0 && pcVar20 == (curl_httppost *)0x0) goto LAB_00496078;
LAB_00495dad:
      if ((plVar13[5] != 0) && ((*(byte *)(plVar13 + 8) & 1) != 0)) goto LAB_00496078;
      uVar21 = (uint)plVar13[8];
      if (((~uVar21 & 9) == 0) ||
         (((~uVar21 & 10) == 0 || ((~uVar21 & 0x30) == 0 && plVar13[9] == 0)))) goto LAB_00496078;
      if (((plVar13[8] & 0x11U) != 0) && (plVar13[6] == 0)) {
        pcVar18 = *(char **)((long)plVar13 + (ulong)(uVar21 & 0x10) * 4 + 0x18);
        pcVar25 = pcVar24;
        if (pcVar24 == (char *)0x0) {
          pcVar25 = "application/octet-stream";
        }
        if (pcVar18 != (char *)0x0) {
          lVar27 = 8;
          do {
            sVar16 = strlen(pcVar18);
            pcVar1 = *(char **)(&UNK_005bb9a8 + lVar27);
            sVar17 = strlen(pcVar1);
            if ((sVar17 <= sVar16) &&
               (iVar11 = curl_strequal(pcVar18 + (sVar16 - sVar17),pcVar1), iVar11 != 0)) {
              pcVar25 = *(char **)((long)&ContentTypeForFilename_ctts + lVar27);
              break;
            }
            lVar27 = lVar27 + 0x10;
          } while (lVar27 != 0x68);
        }
        pcVar18 = (*p_Var9)(pcVar25);
        plVar13[6] = (long)pcVar18;
        if (pcVar18 == (char *)0x0) {
          CVar26 = CURL_FORMADD_MEMORY;
          break;
        }
        *(undefined1 *)(plVar13 + 7) = 1;
      }
      if ((plVar13 == plVar12) && ((plVar13[8] & 4U) == 0)) {
        if ((char *)*plVar13 != (char *)0x0) {
          pcVar18 = memdup((char *)*plVar13,plVar13[2]);
          *plVar13 = (long)pcVar18;
        }
        if (*plVar13 != 0) {
          *(undefined1 *)(plVar13 + 1) = 1;
          goto LAB_00495eff;
        }
LAB_00496080:
        CVar26 = CURL_FORMADD_MEMORY;
        break;
      }
LAB_00495eff:
      if ((*(byte *)(plVar13 + 8) & 0x6b) == 0) {
        pcVar18 = memdup((char *)plVar13[3],plVar13[5]);
        plVar13[3] = (long)pcVar18;
        if (pcVar18 == (char *)0x0) goto LAB_00496080;
        *(undefined1 *)(plVar13 + 4) = 1;
      }
      pcVar18 = (char *)*plVar13;
      sVar16 = plVar13[2];
      pcVar25 = (char *)plVar13[3];
      lVar27 = plVar13[5];
      pcVar1 = (char *)plVar13[9];
      lVar2 = plVar13[10];
      pcVar3 = (char *)plVar13[6];
      lVar4 = plVar13[8];
      pcVar5 = (curl_slist *)plVar13[0xe];
      pcVar6 = (char *)plVar13[0xb];
      pvVar7 = (void *)plVar13[0xd];
      pcVar19 = (curl_httppost *)(*Curl_ccalloc)(1,0x68);
      if (pcVar19 == (curl_httppost *)0x0) {
        pcVar19 = (curl_httppost *)0x0;
      }
      else {
        pcVar19->name = pcVar18;
        if (pcVar18 == (char *)0x0) {
          sVar16 = 0;
        }
        else if (sVar16 == 0) {
          sVar16 = strlen(pcVar18);
        }
        pcVar19->namelength = sVar16;
        pcVar19->contents = pcVar25;
        pcVar19->contentslength = lVar27;
        pcVar19->buffer = pcVar1;
        pcVar19->bufferlength = lVar2;
        pcVar19->contenttype = pcVar3;
        pcVar19->contentheader = pcVar5;
        pcVar19->showfilename = pcVar6;
        pcVar19->userp = pvVar7;
        pcVar19->flags = lVar4;
        if (pcVar20 == (curl_httppost *)0x0) {
          pcVar20 = *last_post;
          if (*last_post == (curl_httppost *)0x0) {
            pcVar20 = (curl_httppost *)httppost;
          }
          pcVar20->next = pcVar19;
          ppcVar23 = last_post;
        }
        else {
          pcVar19->more = pcVar20->more;
          ppcVar23 = &pcVar20->more;
        }
        *ppcVar23 = pcVar19;
      }
      if (pcVar19 == (curl_httppost *)0x0) goto LAB_00496080;
      plVar14 = plVar13 + 6;
      plVar13 = (long *)plVar13[0xf];
      if ((char *)*plVar14 != (char *)0x0) {
        pcVar24 = (char *)*plVar14;
      }
      pcVar20 = pcVar19;
    } while (plVar13 != (long *)0x0);
    if (CVar26 == CURL_FORMADD_OK) {
      CVar26 = CURL_FORMADD_OK;
    }
    else {
      for (; plVar13 != (long *)0x0; plVar13 = (long *)plVar13[0xf]) {
        if ((char)plVar13[1] == '\x01') {
          if ((void *)*plVar13 != (void *)0x0) {
            (*Curl_cfree)((void *)*plVar13);
            *plVar13 = 0;
          }
          *(undefined1 *)(plVar13 + 1) = 0;
        }
        if ((char)plVar13[4] == '\x01') {
          if ((void *)plVar13[3] != (void *)0x0) {
            (*Curl_cfree)((void *)plVar13[3]);
            plVar13[3] = 0;
          }
          *(undefined1 *)(plVar13 + 4) = 0;
        }
        if ((char)plVar13[7] == '\x01') {
          if ((void *)plVar13[6] != (void *)0x0) {
            (*Curl_cfree)((void *)plVar13[6]);
            plVar13[6] = 0;
          }
          *(undefined1 *)(plVar13 + 7) = 0;
        }
        if ((char)plVar13[0xc] == '\x01') {
          if ((void *)plVar13[0xb] != (void *)0x0) {
            (*Curl_cfree)((void *)plVar13[0xb]);
            plVar13[0xb] = 0;
          }
          *(undefined1 *)(plVar13 + 0xc) = 0;
        }
      }
    }
  }
  do {
    plVar13 = (long *)plVar12[0xf];
    (*Curl_cfree)(plVar12);
    plVar12 = plVar13;
  } while (plVar13 != (long *)0x0);
  return CVar26;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}